

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode telnet_do(Curl_easy *data,_Bool *done)

{
  char *data_00;
  uchar **ppuVar1;
  char cVar2;
  byte bVar3;
  curl_socket_t cVar4;
  TELNET *pTVar5;
  uchar *puVar6;
  byte *pbVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  int iVar10;
  CURLcode CVar11;
  TELNET *pTVar12;
  char *pcVar13;
  curl_slist *pcVar14;
  char *pcVar15;
  curl_slist *pcVar16;
  size_t sVar17;
  timediff_t tVar18;
  char *pcVar19;
  int option;
  uint nfds;
  ulong uVar20;
  uint uVar21;
  CURLcode CVar22;
  long size;
  long lVar23;
  bool bVar24;
  timediff_t timeout_ms;
  bool bVar25;
  curltime cVar26;
  curltime newer;
  curltime older;
  ssize_t nread;
  pollfd pfd [2];
  char buffer [4096];
  uint local_10a4;
  curl_off_t local_1090;
  long local_1088;
  TELNET *local_1080;
  pollfd local_1078;
  int local_1070;
  undefined2 local_106c;
  ushort local_106a;
  ulong local_1068;
  ulong local_1060;
  uchar *local_1058;
  long local_1050;
  long local_1048;
  connectdata *local_1040;
  char *local_1038 [513];
  
  local_1040 = data->conn;
  cVar4 = local_1040->sock[0];
  *done = true;
  pTVar12 = (TELNET *)(*Curl_ccalloc)(1,0x1e58);
  if (pTVar12 == (TELNET *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_dyn_init(&pTVar12->out,0xffff);
  (data->req).p.telnet = pTVar12;
  pTVar12->telrcv_state = CURL_TS_DATA;
  pTVar12->subpointer = pTVar12->subbuffer;
  pTVar12->us_preferred[3] = 1;
  pTVar12->him_preferred[3] = 1;
  pTVar12->us_preferred[0] = 1;
  pTVar12->him_preferred[0] = 1;
  pTVar12->him_preferred[1] = 1;
  pTVar12->subnegotiation[0x1f] = 1;
  CVar22 = CURLE_OK;
  pTVar12 = (data->req).p.telnet;
  local_1080 = pTVar12;
  if ((data->state).aptr.user == (char *)0x0) {
LAB_0015d2fc:
    local_1060 = CONCAT44(local_1060._4_4_,cVar4);
    pcVar14 = (data->set).telnet_options;
    if (pcVar14 == (curl_slist *)0x0) {
      bVar25 = true;
      CVar22 = CURLE_OK;
    }
    else {
      CVar22 = CURLE_OK;
      do {
        pcVar13 = pcVar14->data;
        pcVar15 = strchr(pcVar13,0x3d);
        if (pcVar15 == (char *)0x0) {
LAB_0015d3f4:
          Curl_failf(data,"Syntax error in telnet option: %s",pcVar13);
          CVar22 = CURLE_SETOPT_OPTION_SYNTAX;
        }
        else {
          data_00 = pcVar15 + 1;
          pcVar19 = data_00;
          do {
            cVar2 = *pcVar19;
            pcVar19 = pcVar19 + 1;
          } while ('\0' < cVar2);
          if (cVar2 == '\0') {
            switch((long)pcVar15 - (long)pcVar13) {
            case 2:
              iVar10 = curl_strnequal(pcVar13,"WS",2);
              if (iVar10 != 0) {
                local_1078.fd = 0;
                local_1078.events = 0;
                local_1078.revents = 0;
                local_1090 = 0;
                local_1038[0] = data_00;
                iVar10 = Curl_str_number(local_1038,(curl_off_t *)&local_1078,0xffff);
                if (((iVar10 != 0) || (iVar10 = Curl_str_single(local_1038,'x'), iVar10 != 0)) ||
                   (iVar10 = Curl_str_number(local_1038,&local_1090,0xffff), iVar10 != 0)) {
                  pcVar13 = pcVar14->data;
                  goto LAB_0015d3f4;
                }
                local_1080->subopt_wsx = (unsigned_short)local_1078.fd;
                local_1080->subopt_wsy = (unsigned_short)local_1090;
                local_1080->us_preferred[0x1f] = 1;
                goto LAB_0015d513;
              }
              break;
            default:
              Curl_failf(data,"Unknown telnet option %s",pcVar13);
              break;
            case 5:
              iVar10 = curl_strnequal(pcVar13,"TTYPE",5);
              if (iVar10 != 0) {
                local_1080->subopt_ttype = data_00;
                local_1080->us_preferred[0x18] = 1;
                goto LAB_0015d513;
              }
              break;
            case 6:
              iVar10 = curl_strnequal(pcVar13,"BINARY",6);
              if (iVar10 != 0) {
                iVar10 = atoi(data_00);
                if (iVar10 != 1) {
                  local_1080->us_preferred[0] = 0;
                  local_1080->him_preferred[0] = 0;
                }
                goto LAB_0015d513;
              }
              break;
            case 7:
              iVar10 = curl_strnequal(pcVar13,"NEW_ENV",7);
              pTVar12 = local_1080;
              if (iVar10 != 0) {
                pcVar16 = curl_slist_append(local_1080->telnet_vars,data_00);
                if (pcVar16 == (curl_slist *)0x0) {
                  CVar22 = CURLE_OUT_OF_MEMORY;
                }
                else {
                  pTVar12->telnet_vars = pcVar16;
                  pTVar12->us_preferred[0x27] = 1;
                }
                goto LAB_0015d513;
              }
              break;
            case 8:
              iVar10 = curl_strnequal(pcVar13,"XDISPLOC",8);
              if (iVar10 != 0) {
                local_1080->subopt_xdisploc = data_00;
                local_1080->us_preferred[0x23] = 1;
                goto LAB_0015d513;
              }
            }
            CVar22 = CURLE_UNKNOWN_OPTION;
          }
        }
LAB_0015d513:
        pcVar14 = pcVar14->next;
        bVar25 = CVar22 == CURLE_OK;
      } while ((pcVar14 != (curl_slist *)0x0) && (CVar22 == CURLE_OK));
    }
    pTVar12 = local_1080;
    if (!bVar25) {
      curl_slist_free_all(local_1080->telnet_vars);
      pTVar12->telnet_vars = (curl_slist *)0x0;
    }
  }
  else {
    pcVar13 = data->conn->user;
    do {
      cVar2 = *pcVar13;
      pcVar13 = pcVar13 + 1;
    } while ('\0' < cVar2);
    if (cVar2 == '\0') {
      curl_msnprintf((char *)local_1038,0x100,"USER,%s");
      pcVar14 = curl_slist_append(pTVar12->telnet_vars,(char *)local_1038);
      if (pcVar14 == (curl_slist *)0x0) {
        curl_slist_free_all(pTVar12->telnet_vars);
        pTVar12->telnet_vars = (curl_slist *)0x0;
        CVar22 = CURLE_OUT_OF_MEMORY;
        goto LAB_0015d2a9;
      }
      pTVar12->telnet_vars = pcVar14;
      pTVar12->us_preferred[0x27] = 1;
      bVar25 = true;
    }
    else {
      CVar22 = CURLE_BAD_FUNCTION_ARGUMENT;
LAB_0015d2a9:
      bVar25 = false;
    }
    local_1060._0_4_ = cVar4;
    if (bVar25) goto LAB_0015d2fc;
  }
  if (CVar22 != CURLE_OK) {
    return CVar22;
  }
  local_1078.events = 1;
  local_1078.fd = (curl_socket_t)local_1060;
  local_1060 = *(ulong *)&(data->set).field_0x89c;
  bVar25 = true;
  if ((local_1060 & 0x10) == 0) {
    local_1070 = fileno((FILE *)(data->state).in);
    local_106c = 1;
    timeout_ms = 1000;
    nfds = 2;
    uVar21 = 2;
    if (local_1070 < 0) {
      bVar25 = false;
      Curl_failf(data,"cannot read input");
      CVar22 = CURLE_RECV_ERROR;
      goto LAB_0015d5fe;
    }
  }
  else {
    timeout_ms = 100;
    uVar21 = 1;
  }
  nfds = uVar21;
  CVar22 = CURLE_OK;
LAB_0015d5fe:
  local_1048 = 0;
  size = 0;
  do {
    do {
      bVar24 = bVar25;
      if (!bVar24) goto LAB_0015e043;
      iVar10 = Curl_poll(&local_1078,nfds,timeout_ms);
      bVar25 = false;
    } while (iVar10 == -1);
    if (iVar10 == 0) {
      local_1078 = (pollfd)((ulong)local_1078 & 0xffffffffffff);
      local_106a = 0;
    }
    if (((ulong)local_1078 & 0x1000000000000) == 0) {
LAB_0015d646:
      local_1090 = 0;
      if ((local_1060 & 0x10) == 0) {
        if ((local_106a & 1) != 0) {
          local_1090 = read(local_1070,local_1038,0x1000);
        }
      }
      else {
        sVar17 = (*(data->state).fread_func)((char *)local_1038,1,0x1000,(data->state).in);
        iVar10 = (int)sVar17;
        local_1090 = (curl_off_t)iVar10;
        if (iVar10 == 0x10000000) {
LAB_0015d737:
          bVar24 = false;
          goto LAB_0015df7c;
        }
        if (iVar10 == 0x10000001) goto LAB_0015df7c;
      }
      if (local_1090 < 1) {
        if (local_1090 != 0) {
          bVar24 = false;
        }
      }
      else {
        CVar11 = send_telnet_data(data,(char *)local_1038,local_1090);
        CVar22 = CURLE_OK;
        if (CVar11 == CURLE_OK) {
          local_1048 = local_1048 + local_1090;
          Curl_pgrsSetUploadCounter(data,local_1048);
        }
        else {
LAB_0015df76:
          CVar22 = CVar11;
          bVar24 = false;
        }
      }
    }
    else {
      CVar22 = Curl_xfer_recv(data,(char *)local_1038,0x1000,&local_1090);
      if (CVar22 == CURLE_OK) {
        if (0 < local_1090) {
          size = local_1090 + size;
          CVar11 = Curl_pgrsSetDownloadCounter(data,size);
          if (CVar11 == CURLE_OK) {
            local_1050 = local_1090;
            local_1088 = size;
            if (local_1090 == 0) {
              local_10a4 = 0xffffffff;
              local_1050 = 0;
            }
            else {
              pTVar12 = (data->req).p.telnet;
              ppuVar1 = &pTVar12->subpointer;
              local_1058 = pTVar12->subbuffer;
              local_10a4 = 0xffffffff;
              lVar23 = 0;
              do {
                if (CURL_TS_SE < pTVar12->telrcv_state) goto LAB_0015de8d;
                bVar3 = *(byte *)((long)local_1038 + lVar23);
                uVar20 = (ulong)bVar3;
                uVar21 = (uint)bVar3;
                switch(pTVar12->telrcv_state) {
                case CURL_TS_DATA:
                  if (bVar3 == 0xd) {
                    pTVar12->telrcv_state = CURL_TS_CR;
                  }
                  else if (bVar3 == 0xff) {
                    pTVar12->telrcv_state = CURL_TS_IAC;
                    goto LAB_0015da2e;
                  }
LAB_0015dd9c:
                  if ((int)local_10a4 < 0) {
                    local_10a4 = (uint)lVar23;
                  }
                  break;
                case CURL_TS_IAC:
switchD_0015d7d5_caseD_1:
                  switch(uVar21) {
                  case 0xfa:
                    pTVar12->subpointer = local_1058;
LAB_0015dbaf:
                    pTVar12->telrcv_state = CURL_TS_SB;
                    break;
                  case 0xfb:
                    pTVar12->telrcv_state = CURL_TS_WILL;
                    break;
                  case 0xfc:
                    pTVar12->telrcv_state = CURL_TS_WONT;
                    break;
                  case 0xfd:
                    pTVar12->telrcv_state = CURL_TS_DO;
                    break;
                  case 0xfe:
                    pTVar12->telrcv_state = CURL_TS_DONT;
                    break;
                  case 0xff:
                    pTVar12->telrcv_state = CURL_TS_DATA;
                    goto LAB_0015dd9c;
                  default:
                    pTVar12->telrcv_state = CURL_TS_DATA;
                    printoption(data,"RCVD",0xff,uVar21);
                  }
                  break;
                case CURL_TS_WILL:
                  printoption(data,"RCVD",0xfb,(uint)bVar3);
                  pTVar12->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar10 = pTVar5->him[uVar20];
                  if (iVar10 == 3) {
                    iVar10 = pTVar5->himq[uVar20];
                    if (iVar10 != 1) goto joined_r0x0015dc90;
                    pTVar5->him[uVar20] = 1;
                    pTVar5->himq[uVar20] = 0;
                  }
                  else if (iVar10 == 2) {
                    if (pTVar5->himq[uVar20] == 1) {
                      pTVar5->him[uVar20] = 3;
                      pTVar5->himq[uVar20] = 0;
                      goto LAB_0015de70;
                    }
                    if (pTVar5->himq[uVar20] == 0) {
                      pTVar5->him[uVar20] = 1;
                    }
                  }
                  else if (iVar10 == 0) {
                    if (pTVar5->him_preferred[uVar20] == 1) {
                      pTVar5->him[uVar20] = 1;
                      iVar10 = 0xfd;
                      goto LAB_0015de78;
                    }
LAB_0015de70:
                    iVar10 = 0xfe;
LAB_0015de78:
                    send_negotiation(data,iVar10,(uint)bVar3);
                  }
                  goto LAB_0015de82;
                case CURL_TS_WONT:
                  printoption(data,"RCVD",0xfc,(uint)bVar3);
                  pTVar12->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar10 = pTVar5->him[uVar20];
                  if (iVar10 == 3) {
                    iVar10 = pTVar5->himq[uVar20];
                    if (iVar10 == 1) {
                      pTVar5->him[uVar20] = 2;
                      pTVar5->himq[uVar20] = 0;
                      iVar10 = 0xfd;
LAB_0015defc:
                      send_negotiation(data,iVar10,(uint)bVar3);
                    }
                    else {
joined_r0x0015dc90:
                      if (iVar10 == 0) {
                        pTVar5->him[uVar20] = 0;
                      }
                    }
                  }
                  else if (iVar10 == 2) {
                    iVar10 = pTVar5->himq[uVar20];
                    if (iVar10 != 1) goto joined_r0x0015dc90;
                    pTVar5->him[uVar20] = 0;
                    pTVar5->himq[uVar20] = 0;
                  }
                  else if (iVar10 == 1) {
                    pTVar5->him[uVar20] = 0;
                    goto LAB_0015de70;
                  }
                  goto LAB_0015de82;
                case CURL_TS_DO:
                  local_1068 = uVar20;
                  printoption(data,"RCVD",0xfd,(uint)bVar3);
                  uVar20 = local_1068;
                  pTVar12->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar10 = pTVar5->us[local_1068];
                  if (iVar10 == 3) {
                    if (pTVar5->usq[local_1068] == 1) {
                      pTVar5->us[local_1068] = 1;
                      pTVar5->usq[local_1068] = 0;
                    }
                    else if (pTVar5->usq[local_1068] == 0) {
                      pTVar5->us[local_1068] = 0;
                    }
                  }
                  else {
                    option = (int)local_1068;
                    if (iVar10 == 2) {
                      if (pTVar5->usq[local_1068] == 1) {
                        pTVar5->us[local_1068] = 3;
                        pTVar5->himq[local_1068] = 0;
LAB_0015de1d:
                        send_negotiation(data,0xfc,option);
                      }
                      else if ((pTVar5->usq[local_1068] == 0) &&
                              (pTVar5->us[local_1068] = 1, pTVar5->subnegotiation[local_1068] == 1))
                      {
                        uVar20 = local_1068 & 0xffffffff;
                        goto LAB_0015de01;
                      }
                    }
                    else if (iVar10 == 0) {
                      if (pTVar5->us_preferred[local_1068] == 1) {
                        pTVar5->us[local_1068] = 1;
                        send_negotiation(data,0xfb,option);
                        uVar20 = local_1068;
                        if (pTVar5->subnegotiation[local_1068] != 1) goto LAB_0015de46;
                      }
                      else {
                        if (pTVar5->subnegotiation[local_1068] != 1) goto LAB_0015de1d;
                        pTVar5->us[local_1068] = 1;
                        send_negotiation(data,0xfb,option);
                        uVar20 = uVar20 & 0xffffffff;
                      }
LAB_0015de01:
                      sendsuboption(data,(int)uVar20);
                    }
                  }
LAB_0015de46:
                  pTVar12->telrcv_state = CURL_TS_DATA;
                  break;
                case CURL_TS_DONT:
                  printoption(data,"RCVD",0xfe,(uint)bVar3);
                  pTVar12->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar10 = pTVar5->us[uVar20];
                  if (iVar10 == 3) {
                    iVar10 = pTVar5->usq[uVar20];
                    if (iVar10 == 1) {
                      pTVar5->us[uVar20] = 2;
                      pTVar5->usq[uVar20] = 0;
                      iVar10 = 0xfb;
                      goto LAB_0015defc;
                    }
joined_r0x0015dcff:
                    if (iVar10 == 0) {
                      pTVar5->us[uVar20] = 0;
                    }
                  }
                  else if (iVar10 == 2) {
                    iVar10 = pTVar5->usq[uVar20];
                    if (iVar10 != 1) goto joined_r0x0015dcff;
                    pTVar5->us[uVar20] = 0;
                    pTVar5->usq[uVar20] = 0;
                  }
                  else if (iVar10 == 1) {
                    pTVar5->us[uVar20] = 0;
                    iVar10 = 0xfc;
                    goto LAB_0015de78;
                  }
                  goto LAB_0015de82;
                case CURL_TS_CR:
                  pTVar12->telrcv_state = CURL_TS_DATA;
                  if (bVar3 != 0) goto LAB_0015dd9c;
LAB_0015da2e:
                  if ((int)local_10a4 < 0) {
                    local_10a4 = 0xffffffff;
                  }
                  else {
                    CVar11 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_10a4)
                                               ,(long)(int)((uint)lVar23 - local_10a4));
                    local_10a4 = 0xffffffff;
                    size = local_1088;
                    if (CVar11 != CURLE_OK) goto LAB_0015df6f;
                  }
                  break;
                case CURL_TS_SB:
                  if (bVar3 == 0xff) {
                    pTVar12->telrcv_state = CURL_TS_SE;
                  }
                  else {
                    pbVar7 = *ppuVar1;
                    if (pbVar7 < ppuVar1) {
                      *ppuVar1 = pbVar7 + 1;
                      *pbVar7 = bVar3;
                    }
                  }
                  break;
                case CURL_TS_SE:
                  puVar6 = *ppuVar1;
                  if (bVar3 != 0xf0) {
                    if (bVar3 != 0xff) {
                      if (puVar6 < ppuVar1) {
                        *ppuVar1 = puVar6 + 1;
                        *puVar6 = 0xff;
                      }
                      pbVar7 = *ppuVar1;
                      if (pbVar7 < ppuVar1) {
                        *ppuVar1 = pbVar7 + 1;
                        *pbVar7 = bVar3;
                      }
                      pTVar12->subend = pTVar12->subpointer + -2;
                      pTVar12->subpointer = local_1058;
                      local_1068 = uVar20;
                      printoption(data,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                      suboption(data);
                      uVar21 = (uint)local_1068;
                      pTVar12->telrcv_state = CURL_TS_IAC;
                      goto switchD_0015d7d5_caseD_1;
                    }
                    if (puVar6 < ppuVar1) {
                      *ppuVar1 = puVar6 + 1;
                      *puVar6 = 0xff;
                    }
                    goto LAB_0015dbaf;
                  }
                  if (puVar6 < ppuVar1) {
                    *ppuVar1 = puVar6 + 1;
                    *puVar6 = 0xff;
                  }
                  puVar6 = *ppuVar1;
                  if (puVar6 < ppuVar1) {
                    *ppuVar1 = puVar6 + 1;
                    *puVar6 = 0xf0;
                  }
                  pTVar12->subend = pTVar12->subpointer + -2;
                  pTVar12->subpointer = local_1058;
                  suboption(data);
LAB_0015de82:
                  pTVar12->telrcv_state = CURL_TS_DATA;
                }
LAB_0015de8d:
                lVar23 = lVar23 + 1;
              } while (local_1050 != lVar23);
            }
            size = local_1088;
            if (((int)local_10a4 < 0) ||
               (CVar11 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_10a4),
                                           (long)(int)((int)local_1050 - local_10a4)),
               CVar11 == CURLE_OK)) {
              CVar11 = CURLE_OK;
            }
          }
LAB_0015df6f:
          pTVar12 = local_1080;
          CVar22 = CURLE_OK;
          if (CVar11 == CURLE_OK) {
            local_1088 = size;
            if ((local_1080->please_negotiate != 0) && (local_1080->already_negotiated == 0)) {
              negotiate(data);
              pTVar12->already_negotiated = 1;
              size = local_1088;
            }
            goto LAB_0015d646;
          }
          goto LAB_0015df76;
        }
        bVar24 = false;
        CVar22 = CURLE_OK;
      }
      else if (CVar22 != CURLE_AGAIN) goto LAB_0015d737;
    }
LAB_0015df7c:
    if ((data->set).timeout != 0) {
      cVar26 = Curl_now();
      uVar8 = (local_1040->created).tv_sec;
      uVar9 = (local_1040->created).tv_usec;
      older.tv_usec = uVar9;
      older.tv_sec = uVar8;
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar26._0_12_,0);
      newer.tv_usec = SUB124(cVar26._0_12_,8);
      older._12_4_ = 0;
      tVar18 = Curl_timediff(newer,older);
      if ((long)(ulong)(data->set).timeout <= tVar18) {
        bVar24 = false;
        Curl_failf(data,"Time-out");
        CVar22 = CURLE_OPERATION_TIMEDOUT;
      }
    }
    iVar10 = Curl_pgrsUpdate(data);
    bVar25 = bVar24;
  } while (iVar10 == 0);
  CVar22 = CURLE_ABORTED_BY_CALLBACK;
LAB_0015e043:
  Curl_xfer_setup_nop(data);
  return CVar22;
}

Assistant:

static CURLcode telnet_do(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  timediff_t interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char buffer[4*1024];
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(data);
  if(result)
    return result;

  tn = data->req.p.telnet;

  result = check_telnet_options(data);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /* We want to wait for both stdin and the socket. Since
  ** the select() function in Winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = WSACreateEvent();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Tell Winsock what events we want to listen to */
  if(WSAEventSelect(sockfd, event_handle, FD_READ|FD_CLOSE) == SOCKET_ERROR) {
    WSACloseEvent(event_handle);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Do not wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)sizeof(buffer);
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {

    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buffer, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buffer, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(data, buffer, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buffer, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(data, buffer, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:
    {
      events.lNetworkEvents = 0;
      if(WSAEnumNetworkEvents(sockfd, event_handle, &events) == SOCKET_ERROR) {
        err = SOCKERRNO;
        if(err != SOCKEINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(data, (unsigned char *) buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
    }
    break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!WSACloseEvent(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
    if(pfd[1].fd < 0) {
      failf(data, "cannot read input");
      result = CURLE_RECV_ERROR;
      keepon = FALSE;
    }
  }

  while(keepon) {
    DEBUGF(infof(data, "telnet_do, poll %d fds", poll_cnt));
    switch(Curl_poll(pfd, (unsigned int)poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      FALLTHROUGH();
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          /* In test 1452, macOS sees a ECONNRESET sometimes? Is this the
           * telnet test server not shutting down the socket in a clean way?
           * Seems to be timing related, happens more on slow debug build */
          if(data->state.os_errno == SOCKECONNRESET) {
            DEBUGF(infof(data, "telnet_do, unexpected ECONNRESET on recv"));
          }
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        result = Curl_pgrsSetDownloadCounter(data, total_dl);
        if(!result)
          result = telrcv(data, (unsigned char *)buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buffer, sizeof(buffer));
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buffer, 1, sizeof(buffer),
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(data, buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_xfer_setup_nop(data);

  return result;
}